

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

uint __thiscall crnlib::command_line_params::get_count(command_line_params *this,char *pKey)

{
  bool bVar1;
  uint n;
  param_map_const_iterator end;
  param_map_const_iterator begin;
  _Self in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar3;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_20;
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  local_18 [3];
  
  std::
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  ::_Rb_tree_const_iterator(local_18);
  std::
  _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
  ::_Rb_tree_const_iterator(&local_20);
  find(this,pKey,(param_map_const_iterator *)begin._M_node,(param_map_const_iterator *)end._M_node);
  uVar3 = 0;
  while( true ) {
    iVar2 = (int)((ulong)in_stack_ffffffffffffffd0._M_node >> 0x20);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    uVar3 = uVar3 + 1;
    in_stack_ffffffffffffffd0 =
         std::
         _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
         ::operator++((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                       *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),iVar2);
  }
  return uVar3;
}

Assistant:

uint command_line_params::get_count(const char* pKey) const {
  param_map_const_iterator begin, end;
  find(pKey, begin, end);

  uint n = 0;

  while (begin != end) {
    n++;
    begin++;
  }

  return n;
}